

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportCallCode(TranslateToFuzzReader *this,Type type)

{
  Name target;
  initializer_list<wasm::Expression_*> __l;
  Name target_00;
  initializer_list<wasm::Expression_*> __l_00;
  bool bVar1;
  size_type sVar2;
  Const *right;
  Name *local_180;
  Name *local_178;
  bool local_161;
  Type local_148;
  Expression *local_140;
  allocator<wasm::Expression_*> local_131;
  Binary *local_130;
  Binary **local_128;
  size_type local_120;
  undefined1 local_118 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Binary *local_f8;
  Expression *index;
  TranslateToFuzzReader *pTStack_e8;
  Index maxIndex;
  TranslateToFuzzReader *local_e0;
  uintptr_t local_d8;
  size_t sStack_d0;
  Type local_c0;
  Expression *local_b8 [3];
  allocator<wasm::Expression_*> local_99;
  uintptr_t local_98;
  Expression *local_90;
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args_1;
  Type local_58;
  Type refType;
  Name refTarget;
  Name exportTarget;
  BasicType local_28;
  BasicType BStack_24;
  bool catching;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  BStack_24 = none;
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,&stack0xffffffffffffffdc);
  local_161 = true;
  if (!bVar1) {
    local_28 = i32;
    local_161 = Type::operator==((Type *)&this_local,&local_28);
  }
  if (local_161 != false) {
    exportTarget.super_IString.str._M_str._0_4_ = 2;
    exportTarget.super_IString.str._M_str._7_1_ =
         Type::operator==((Type *)&this_local,(BasicType *)&exportTarget.super_IString.str._M_str);
    if ((bool)exportTarget.super_IString.str._M_str._7_1_) {
      local_178 = &this->callExportCatchImportName;
    }
    else {
      local_178 = &this->callExportImportName;
    }
    refTarget.super_IString.str._M_str = (char *)(local_178->super_IString).str._M_len;
    exportTarget.super_IString.str._M_len = (size_t)(local_178->super_IString).str._M_str;
    if ((bool)exportTarget.super_IString.str._M_str._7_1_) {
      local_180 = &this->callRefCatchImportName;
    }
    else {
      local_180 = &this->callRefImportName;
    }
    refType.id = (local_180->super_IString).str._M_len;
    refTarget.super_IString.str._M_len = (size_t)(local_180->super_IString).str._M_str;
    bVar1 = IString::operator_cast_to_bool((IString *)&refType);
    if ((!bVar1) ||
       ((((exportTarget.super_IString.str._M_str._7_1_ & 1) == 0 ||
         ((bVar1 = IString::operator_cast_to_bool((IString *)&refTarget.super_IString.str._M_str),
          bVar1 && (bVar1 = oneIn(this,2), !bVar1)))) &&
        (((exportTarget.super_IString.str._M_str._7_1_ & 1) != 0 || (bVar1 = oneIn(this,4), !bVar1))
        )))) {
      bVar1 = IString::operator_cast_to_bool((IString *)&refTarget.super_IString.str._M_str);
      if (bVar1) {
        sVar2 = std::
                vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ::size(&this->wasm->exports);
        index._4_4_ = (int)sVar2;
        index._0_4_ = 2;
        bVar1 = Type::operator==((Type *)&this_local,(BasicType *)&index);
        if (bVar1) {
          index._4_4_ = (index._4_4_ + 1) * 2;
        }
        Type::Type((Type *)&args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,i32);
        local_f8 = (Binary *)
                   make(this,(Type)args.
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((this->allowOOB & 1U) == 0) || (bVar1 = oneIn(this,10), !bVar1)) {
          right = Builder::makeConst<int>(&this->builder,index._4_4_);
          local_f8 = Builder::makeBinary(&this->builder,RemUInt32,(Expression *)local_f8,
                                         (Expression *)right);
        }
        local_130 = local_f8;
        local_128 = &local_130;
        local_120 = 1;
        std::allocator<wasm::Expression_*>::allocator(&local_131);
        __l._M_len = local_120;
        __l._M_array = (iterator)local_128;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_118,__l,
                   &local_131);
        std::allocator<wasm::Expression_*>::~allocator(&local_131);
        if ((exportTarget.super_IString.str._M_str._7_1_ & 1) == 0) {
          Type::Type(&local_148,i32);
          local_140 = make(this,local_148);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_118,
                     &local_140);
        }
        target.super_IString.str._M_str = (char *)exportTarget.super_IString.str._M_len;
        target.super_IString.str._M_len = (size_t)refTarget.super_IString.str._M_str;
        type_local.id =
             (uintptr_t)
             Builder::makeCall(&this->builder,target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               local_118,(Type)this_local,false);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_118);
      }
      else {
        pTStack_e8 = this_local;
        type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
      }
    }
    else {
      HeapType::HeapType((HeapType *)
                         &args_1.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,func);
      bVar1 = oneIn(this,10);
      Type::Type(&local_58,
                 (HeapType)
                 args_1.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,(uint)bVar1,Inexact);
      local_98 = local_58.id;
      local_90 = make(this,local_58);
      local_88 = &local_90;
      local_80 = 1;
      std::allocator<wasm::Expression_*>::allocator(&local_99);
      __l_00._M_len = local_80;
      __l_00._M_array = local_88;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_78,__l_00,
                 &local_99);
      std::allocator<wasm::Expression_*>::~allocator(&local_99);
      if ((exportTarget.super_IString.str._M_str._7_1_ & 1) == 0) {
        Type::Type(&local_c0,i32);
        local_b8[0] = make(this,local_c0);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_78,
                   local_b8);
      }
      local_d8 = refType.id;
      sStack_d0 = refTarget.super_IString.str._M_len;
      local_e0 = this_local;
      target_00.super_IString.str._M_str = (char *)refTarget.super_IString.str._M_len;
      target_00.super_IString.str._M_len = refType.id;
      type_local.id =
           (uintptr_t)
           Builder::makeCall(&this->builder,target_00,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             local_78,(Type)this_local,false);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_78);
    }
    return (Expression *)type_local.id;
  }
  __assert_fail("type == Type::none || type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x4f3,"Expression *wasm::TranslateToFuzzReader::makeImportCallCode(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeImportCallCode(Type type) {
  // Call code: either an export or a ref. Each has a catching and non-catching
  // variant. The catching variants return i32, the others none.
  assert(type == Type::none || type == Type::i32);
  auto catching = type == Type::i32;
  auto exportTarget =
    catching ? callExportCatchImportName : callExportImportName;
  auto refTarget = catching ? callRefCatchImportName : callRefImportName;

  // We want to call a ref less often, as refs are more likely to error (a
  // function reference can have arbitrary params and results, including things
  // that error on the JS boundary; an export is already filtered for such
  // things in some cases - when we legalize the boundary - and even if not, we
  // emit lots of void(void) functions - all the invoke_foo functions - that are
  // safe to call).
  if (refTarget) {
    // This matters a lot more in the variants that do *not* catch (in the
    // catching ones, we just get a result of 1, but when not caught it halts
    // execution).
    if ((catching && (!exportTarget || oneIn(2))) || (!catching && oneIn(4))) {
      // Most of the time make a non-nullable funcref, to avoid errors.
      auto refType = Type(HeapType::func, oneIn(10) ? Nullable : NonNullable);
      std::vector<Expression*> args = {make(refType)};
      if (!catching) {
        // Only the first bit matters here, so we can send anything (this is
        // future-proof for later bits, and has no downside now).
        args.push_back(make(Type::i32));
      }
      return builder.makeCall(refTarget, args, type);
    }
  }

  if (!exportTarget) {
    // We decided not to emit a call-ref here, due to fear of erroring, and
    // there is no call-export, so just emit something trivial.
    return makeTrivial(type);
  }

  // Pick the maximum export index to call.
  Index maxIndex = wasm.exports.size();
  if (type == Type::i32) {
    // This swallows errors, so we can be less careful, but we do still want to
    // avoid swallowing a lot as executing code is more interesting. (Note that
    // even though we double here, the risk is not that great: we are still
    // adding functions as we go, so the first half of functions/exports can
    // double here and still end up in bounds by the time we've added them all.)
    maxIndex = (maxIndex + 1) * 2;
  }

  // Most of the time, call a valid export index in the range we picked, but
  // sometimes allow anything at all.
  auto* index = make(Type::i32);
  if (!allowOOB || !oneIn(10)) {
    index = builder.makeBinary(
      RemUInt32, index, builder.makeConst(int32_t(maxIndex)));
  }

  // The non-catching variants send a flags argument, which says whether to
  // catch+rethrow.
  std::vector<Expression*> args = {index};
  if (!catching) {
    // Only the first bit matters here, so we can send anything (this is
    // future-proof for later bits, and has no downside now).
    args.push_back(make(Type::i32));
  }
  return builder.makeCall(exportTarget, args, type);
}